

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void selectInnerLoop(Parse *pParse,Select *p,int srcTab,SortCtx *pSort,DistinctCtx *pDistinct,
                    SelectDest *pDest,int iContinue,int iBreak)

{
  ushort uVar1;
  uint uVar2;
  Vdbe *p_00;
  char *zP4;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Op *pOVar9;
  CollSeq *zP4_00;
  int iVar10;
  int iVar11;
  uint uVar12;
  u8 uVar13;
  int op;
  long lVar14;
  ExprList *pEVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  RowLoadInfo sRowLoadInfo;
  SortCtx *local_98;
  RowLoadInfo local_38;
  
  if (pDistinct == (DistinctCtx *)0x0) {
    uVar13 = '\0';
  }
  else {
    uVar13 = pDistinct->eTnctType;
  }
  if (pSort == (SortCtx *)0x0) {
    local_98 = (SortCtx *)0x0;
  }
  else {
    local_98 = pSort;
    if (pSort->pOrderBy == (ExprList *)0x0) {
      local_98 = (SortCtx *)0x0;
    }
  }
  p_00 = pParse->pVdbe;
  bVar4 = pDest->eDest;
  iVar8 = pDest->iSDParm;
  if ((uVar13 == '\0' && local_98 == (SortCtx *)0x0) && (0 < p->iOffset)) {
    sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,iContinue,1);
  }
  uVar12 = (uint)bVar4;
  uVar2 = p->pEList->nExpr;
  uVar17 = (ulong)uVar2;
  if (pDest->iSdst == 0) {
    if (local_98 == (SortCtx *)0x0) {
      iVar10 = 0;
    }
    else {
      iVar10 = (~*(uint *)&local_98->sortFlags & 1) + local_98->pOrderBy->nExpr;
      pParse->nMem = pParse->nMem + iVar10;
    }
    iVar6 = pParse->nMem;
    pDest->iSdst = iVar6 + 1;
LAB_00182caa:
    pParse->nMem = iVar6 + uVar2;
  }
  else {
    iVar6 = pParse->nMem;
    iVar10 = 0;
    if (iVar6 < (int)(pDest->iSdst + uVar2)) goto LAB_00182caa;
  }
  pDest->nSdst = uVar2;
  iVar6 = pDest->iSdst;
  iVar7 = iVar6;
  if (srcTab < 0) {
    bVar3 = 1;
    if ((1 < uVar12 - 9) && (uVar12 != 0xd)) {
      if (uVar12 == 3) goto LAB_00182e4a;
      bVar3 = 0;
    }
    if ((uVar13 == '\0' && local_98 != (SortCtx *)0x0) && (bVar4 & 0xfd) != 0xc) {
      iVar11 = local_98->nOBSat;
      lVar18 = (long)iVar11;
      pEVar15 = local_98->pOrderBy;
      if (iVar11 < pEVar15->nExpr) {
        lVar14 = lVar18 * 0x20 + 0x24;
        do {
          iVar11 = iVar11 + 1;
          uVar1 = *(ushort *)((long)pEVar15->a + lVar14 + -8);
          if (uVar1 != 0) {
            p->pEList->a[uVar1 - 1].u.x.iOrderByCol = (short)iVar11 - (short)local_98->nOBSat;
          }
          lVar18 = lVar18 + 1;
          pEVar15 = local_98->pOrderBy;
          lVar14 = lVar14 + 0x20;
        } while (lVar18 < pEVar15->nExpr);
      }
      bVar3 = bVar3 | 0xc;
      lVar18 = (long)p->pEList->nExpr;
      if (0 < lVar18) {
        lVar14 = 0;
        do {
          bVar21 = *(short *)((long)&p->pEList->a[0].u + lVar14) != 0;
          if (bVar21) {
            iVar7 = 0;
          }
          uVar17 = (ulong)((int)uVar17 - (uint)bVar21);
          lVar14 = lVar14 + 0x20;
        } while (lVar18 * 0x20 != lVar14);
      }
    }
    local_38.regResult = iVar6;
    local_38.ecelFlags = bVar3;
    if (((p->iLimit == 0) || ((bVar3 & 8) == 0)) || (iVar10 < 1)) {
      sqlite3ExprCodeExprList(pParse,p->pEList,iVar6,0,bVar3);
    }
    else {
      local_98->pDeferredRowLoad = &local_38;
      iVar7 = 0;
    }
  }
  else if (0 < (int)uVar2) {
    uVar12 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5a,srcTab,uVar12,iVar6 + uVar12);
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
  }
LAB_00182e4a:
  iVar11 = (int)uVar17;
  if (uVar13 != '\0') {
    if (pDistinct->eTnctType == '\x01') {
      sqlite3VdbeChangeToNoop(p_00,pDistinct->addrTnct);
    }
    else if (pDistinct->eTnctType == '\x02') {
      iVar19 = pParse->nMem;
      pParse->nMem = iVar19 + iVar11;
      sqlite3VdbeChangeToNoop(p_00,pDistinct->addrTnct);
      iVar5 = pDistinct->addrTnct;
      if (iVar5 < 0) {
        iVar5 = p_00->nOp + -1;
      }
      iVar19 = iVar19 + 1;
      if (p_00->db->mallocFailed == '\0') {
        pOVar9 = p_00->aOp + iVar5;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar9->opcode = 'I';
      pOVar9->p1 = 1;
      pOVar9->p2 = iVar19;
      if (0 < iVar11) {
        iVar5 = p_00->nOp;
        lVar18 = 8;
        uVar20 = 0;
        do {
          zP4_00 = sqlite3ExprCollSeq(pParse,*(Expr **)((long)p->pEList->a + lVar18 + -8));
          if ((long)uVar20 < (long)(iVar11 + -1)) {
            op = 0x34;
            iVar16 = iVar5 + iVar11;
          }
          else {
            op = 0x35;
            iVar16 = iContinue;
          }
          sqlite3VdbeAddOp3(p_00,op,iVar6 + (int)uVar20,iVar16,iVar19 + (int)uVar20);
          sqlite3VdbeChangeP4(p_00,-1,(char *)zP4_00,-2);
          if (0 < (long)p_00->nOp) {
            p_00->aOp[(long)p_00->nOp + -1].p5 = 0x80;
          }
          uVar20 = uVar20 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar17 != uVar20);
      }
      sqlite3VdbeAddOp3(p_00,0x4e,iVar6,iVar19,iVar11 + -1);
    }
    else {
      codeDistinct(pParse,pDistinct->tabTnct,iContinue,iVar11,iVar6);
    }
    if ((local_98 == (SortCtx *)0x0) && (0 < p->iOffset)) {
      sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,iContinue,1);
    }
  }
  switch(bVar4) {
  case 1:
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar10 = pParse->aTempReg[bVar4];
    }
    sqlite3VdbeAddOp3(p_00,0x5c,iVar6,iVar11,iVar10);
    iVar8 = sqlite3VdbeAddOp3(p_00,0x84,iVar8,iVar10,iVar6);
    if (p_00->db->mallocFailed == '\0') {
      pOVar9 = p_00->aOp;
      pOVar9[iVar8].p4type = -3;
      pOVar9[iVar8].p4.i = iVar11;
    }
    goto joined_r0x00183741;
  case 2:
    iVar10 = 0x85;
    goto LAB_00183680;
  case 3:
    iVar10 = 0x46;
    iVar11 = iVar8;
    iVar8 = 1;
    goto LAB_0018367d;
  case 5:
  case 6:
  case 0xc:
  case 0xe:
    iVar19 = sqlite3GetTempRange(pParse,iVar10 + 1);
    sqlite3VdbeAddOp3(p_00,0x5c,iVar6,iVar11,iVar19 + iVar10);
    if (bVar4 == 6) {
      iVar5 = sqlite3VdbeAddOp3(p_00,0x1d,iVar8 + 1,p_00->nOp + 4,iVar19);
      if (p_00->db->mallocFailed == '\0') {
        pOVar9 = p_00->aOp;
        pOVar9[iVar5].p4type = -3;
        pOVar9[iVar5].p4.i = 0;
      }
      iVar6 = sqlite3VdbeAddOp3(p_00,0x84,iVar8 + 1,iVar19,iVar6);
      if (p_00->db->mallocFailed == '\0') {
        pOVar9 = p_00->aOp;
        pOVar9[iVar6].p4type = -3;
        pOVar9[iVar6].p4.i = iVar11;
      }
    }
    if (local_98 == (SortCtx *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar6 = pParse->nMem + 1;
        pParse->nMem = iVar6;
      }
      else {
        bVar4 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar4;
        iVar6 = pParse->aTempReg[bVar4];
      }
      sqlite3VdbeAddOp3(p_00,0x79,iVar8,iVar6,0);
      sqlite3VdbeAddOp3(p_00,0x7a,iVar8,iVar19,iVar6);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
      }
      if (iVar6 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = iVar6;
        }
      }
    }
    else {
      pushOntoSorter(pParse,local_98,p,iVar19 + iVar10,iVar7,1,iVar10);
    }
    if (iVar10 == 0) {
      if (iVar19 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = iVar19;
        }
      }
    }
    else if (pParse->nRangeReg <= iVar10) {
      pParse->nRangeReg = iVar10 + 1;
      pParse->iRangeReg = iVar19;
    }
    break;
  case 7:
  case 8:
    pEVar15 = pDest->pOrderBy;
    uVar2 = pEVar15->nExpr;
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar10 = pParse->aTempReg[bVar3];
    }
    iVar5 = uVar2 + 2;
    iVar7 = sqlite3GetTempRange(pParse,iVar5);
    iVar16 = iVar7 + uVar2 + 1;
    iVar19 = 0;
    if ((bVar4 == 8) &&
       (iVar19 = sqlite3VdbeAddOp3(p_00,0x1d,iVar8 + 1,0,iVar6), p_00->db->mallocFailed == '\0')) {
      pOVar9 = p_00->aOp;
      pOVar9[iVar19].p4type = -3;
      pOVar9[iVar19].p4.i = iVar11;
    }
    sqlite3VdbeAddOp3(p_00,0x5c,iVar6,iVar11,iVar16);
    if (bVar4 == 8) {
      sqlite3VdbeAddOp3(p_00,0x84,iVar8 + 1,iVar16,0);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 0x10;
      }
    }
    if (0 < (int)uVar2) {
      lVar18 = 0;
      iVar11 = iVar7;
      do {
        sqlite3VdbeAddOp3(p_00,0x4f,(uint)*(ushort *)((long)&pEVar15->a[0].u + lVar18) + iVar6 + -1,
                          iVar11,0);
        iVar11 = iVar11 + 1;
        lVar18 = lVar18 + 0x20;
      } while ((ulong)uVar2 << 5 != lVar18);
    }
    sqlite3VdbeAddOp3(p_00,0x78,iVar8,uVar2 + iVar7,0);
    sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar5,iVar10);
    iVar8 = sqlite3VdbeAddOp3(p_00,0x84,iVar8,iVar10,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar9 = p_00->aOp;
      pOVar9[iVar8].p4type = -3;
      pOVar9[iVar8].p4.i = iVar5;
    }
    if (iVar19 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        iVar8 = p_00->nOp + -1;
        if (-1 < iVar19) {
          iVar8 = iVar19;
        }
        pOVar9 = p_00->aOp + iVar8;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar9->p2 = p_00->nOp;
    }
    if (iVar10 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar10;
      }
    }
    if (iVar5 == 1) {
      if (iVar7 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = iVar7;
        }
      }
    }
    else if (pParse->nRangeReg < iVar5) {
      pParse->nRangeReg = iVar5;
      pParse->iRangeReg = iVar7;
    }
    break;
  case 9:
  case 0xd:
    if (local_98 != (SortCtx *)0x0) goto LAB_00183299;
    if (bVar4 == 0xd) {
      iVar10 = 0xe;
      iVar11 = 0;
      iVar8 = pDest->iSDParm;
    }
    else {
      iVar10 = 0x51;
      iVar8 = iVar6;
    }
LAB_0018367d:
    iVar6 = iVar11;
    iVar11 = 0;
LAB_00183680:
    sqlite3VdbeAddOp3(p_00,iVar10,iVar8,iVar6,iVar11);
    break;
  case 10:
    if (local_98 == (SortCtx *)0x0) break;
LAB_00183299:
    pushOntoSorter(pParse,local_98,p,iVar6,iVar7,iVar11,iVar10);
    break;
  case 0xb:
    if (local_98 != (SortCtx *)0x0) goto LAB_00183299;
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar10 = pParse->aTempReg[bVar4];
    }
    zP4 = pDest->zAffSdst;
    iVar7 = sqlite3VdbeAddOp3(p_00,0x5c,iVar6,iVar11,iVar10);
    sqlite3VdbeChangeP4(p_00,iVar7,zP4,iVar11);
    iVar8 = sqlite3VdbeAddOp3(p_00,0x84,iVar8,iVar10,iVar6);
    if (p_00->db->mallocFailed == '\0') {
      pOVar9 = p_00->aOp;
      pOVar9[iVar8].p4type = -3;
      pOVar9[iVar8].p4.i = iVar11;
    }
joined_r0x00183741:
    if (iVar10 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar10;
      }
    }
  }
  if ((local_98 == (SortCtx *)0x0) && (p->iLimit != 0)) {
    sqlite3VdbeAddOp3(p_00,0x31,p->iLimit,iBreak,0);
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  int srcTab,             /* Pull data from this table if non-negative */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */
  RowLoadInfo sRowLoadInfo;   /* Info for deferred row loading */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( p->pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = p->pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", p->pEList->a[i].zName));
    }
  }else if( eDest!=SRT_Exists ){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    ExprList *pExtra = 0;
#endif
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;    /* "ecel" is an abbreviation of "ExprCodeExprList" */
    ExprList *pEList;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in p->pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated 
      ** iOrderByCol value to one more than the index of the ORDER BY 
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the p->pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);

      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          p->pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
      selectExprDefer(pParse, pSort, p->pEList, &pExtra);
      if( pExtra && pParse->db->mallocFailed==0 ){
        /* If there are any extra PK columns to add to the sorter records,
        ** allocate extra memory cells and adjust the OpenEphemeral 
        ** instruction to account for the larger records. This is only
        ** required if there are one or more WITHOUT ROWID tables with
        ** composite primary keys in the SortCtx.aDefer[] array.  */
        VdbeOp *pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
        pOp->p2 += (pExtra->nExpr - pSort->nDefer);
        pOp->p4.pKeyInfo->nAllField += (pExtra->nExpr - pSort->nDefer);
        pParse->nMem += pExtra->nExpr;
      }
#endif

      /* Adjust nResultCol to account for columns that are omitted
      ** from the sorter by the optimizations in this branch */
      pEList = p->pEList;
      for(i=0; i<pEList->nExpr; i++){
        if( pEList->a[i].u.x.iOrderByCol>0
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
         || pEList->a[i].bSorterRef
#endif
        ){
          nResultCol--;
          regOrig = 0;
        }
      }

      testcase( regOrig );
      testcase( eDest==SRT_Set );
      testcase( eDest==SRT_Mem );
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      assert( eDest==SRT_Set || eDest==SRT_Mem 
           || eDest==SRT_Coroutine || eDest==SRT_Output );
    }
    sRowLoadInfo.regResult = regResult;
    sRowLoadInfo.ecelFlags = ecelFlags;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    sRowLoadInfo.pExtra = pExtra;
    sRowLoadInfo.regExtraResult = regResult + nResultCol;
    if( pExtra ) nResultCol += pExtra->nExpr;
#endif
    if( p->iLimit
     && (ecelFlags & SQLITE_ECEL_OMITREF)!=0 
     && nPrefixReg>0
    ){
      assert( pSort!=0 );
      assert( hasDistinct==0 );
      pSort->pDeferredRowLoad = &sRowLoadInfo;
      regOrig = 0;
    }else{
      innerLoopLoadRow(pParse, p, &sRowLoadInfo);
    }
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nResultCol;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
        for(i=0; i<nResultCol; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, p->pEList->a[i].pExpr);
          if( i<nResultCol-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
            VdbeCoverage(v);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
            VdbeCoverage(v);
           }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nResultCol-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nResultCol,
                     regResult);
        break;
      }
    }
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        assert( regResult==regOrig );
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg, regOrig, 1, nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol, 
            r1, pDest->zAffSdst, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of 
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0, 
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}